

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3MaterializeView(Parse *pParse,Table *pView,Expr *pWhere,int iCur)

{
  sqlite3 *db;
  int iVar1;
  Expr *pWhere_00;
  SrcList *pSrc;
  char *pcVar2;
  Select *p;
  SelectDest dest;
  SelectDest local_58;
  
  db = pParse->db;
  iVar1 = sqlite3SchemaToIndex(db,pView->pSchema);
  pWhere_00 = sqlite3ExprDup(db,pWhere,0);
  pSrc = sqlite3SrcListAppend(db,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
  if (pSrc != (SrcList *)0x0) {
    pcVar2 = sqlite3DbStrDup(db,pView->zName);
    pSrc->a[0].zName = pcVar2;
    pcVar2 = sqlite3DbStrDup(db,db->aDb[iVar1].zDbSName);
    pSrc->a[0].zDatabase = pcVar2;
  }
  p = sqlite3SelectNew(pParse,(ExprList *)0x0,pSrc,pWhere_00,(ExprList *)0x0,(Expr *)0x0,
                       (ExprList *)0x0,0x20000,(Expr *)0x0,(Expr *)0x0);
  local_58.eDest = '\f';
  local_58.zAffSdst = (char *)0x0;
  local_58.iSdst = 0;
  local_58.nSdst = 0;
  local_58.iSDParm = iCur;
  sqlite3Select(pParse,p,&local_58);
  sqlite3SelectDelete(db,p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3MaterializeView(
  Parse *pParse,       /* Parsing context */
  Table *pView,        /* View definition */
  Expr *pWhere,        /* Optional WHERE clause to be added */
  int iCur             /* Cursor number for ephemeral table */
){
  SelectDest dest;
  Select *pSel;
  SrcList *pFrom;
  sqlite3 *db = pParse->db;
  int iDb = sqlite3SchemaToIndex(db, pView->pSchema);
  pWhere = sqlite3ExprDup(db, pWhere, 0);
  pFrom = sqlite3SrcListAppend(db, 0, 0, 0);
  if( pFrom ){
    assert( pFrom->nSrc==1 );
    pFrom->a[0].zName = sqlite3DbStrDup(db, pView->zName);
    pFrom->a[0].zDatabase = sqlite3DbStrDup(db, db->aDb[iDb].zDbSName);
    assert( pFrom->a[0].pOn==0 );
    assert( pFrom->a[0].pUsing==0 );
  }
  pSel = sqlite3SelectNew(pParse, 0, pFrom, pWhere, 0, 0, 0, 
                          SF_IncludeHidden, 0, 0);
  sqlite3SelectDestInit(&dest, SRT_EphemTab, iCur);
  sqlite3Select(pParse, pSel, &dest);
  sqlite3SelectDelete(db, pSel);
}